

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O1

TestCase *
vkt::tessellation::anon_unknown_2::makeIdentityGeometryShaderCase
          (TestContext *testCtx,TessPrimitiveType primitiveType)

{
  TestCase *this;
  long *plVar1;
  long *plVar2;
  char **value;
  long *local_b8;
  long local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  undefined8 local_38;
  
  this = (TestCase *)operator_new(0x78);
  if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    local_38 = *(undefined8 *)(&DAT_00d2f680 + (ulong)primitiveType * 8);
  }
  else {
    local_38 = 0;
  }
  de::toString<char_const*>(&local_58,(de *)&local_38,value);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0xb499d9);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_88 = *plVar2;
    lStack_80 = plVar1[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar2;
    local_98 = (long *)*plVar1;
  }
  local_90 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a8 = *plVar2;
    uStack_a0 = (undefined4)plVar1[3];
    uStack_9c = *(undefined4 *)((long)plVar1 + 0x1c);
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar2;
    local_b8 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Passthrough geometry shader has no effect","");
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(char *)local_b8,(char *)local_78[0]);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00d2f590;
  *(TessPrimitiveType *)&this[1].super_TestCase.super_TestNode._vptr_TestNode = primitiveType;
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

inline TestCase* makeIdentityGeometryShaderCase (tcu::TestContext& testCtx, const TessPrimitiveType primitiveType)
{
	return new IdentityGeometryShaderTestCase(
		testCtx,
		"tessellate_" + de::toString(getTessPrimitiveTypeShaderName(primitiveType)) + "_passthrough_geometry_no_change",
		"Passthrough geometry shader has no effect",
		primitiveType);
}